

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O2

bool __thiscall xmrig::CpuThreads::isEqual(CpuThreads *this,CpuThreads *other)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  
  pCVar4 = (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar4 == pCVar1) {
    pCVar3 = (other->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (other->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar3 == pCVar2) {
      return true;
    }
  }
  else {
    pCVar3 = (other->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (other->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((long)pCVar1 - (long)pCVar4 != (long)pCVar2 - (long)pCVar3) {
    return false;
  }
  for (; ((pCVar4 != pCVar1 && (pCVar3->m_affinity == pCVar4->m_affinity)) &&
         (pCVar3->m_intensity == pCVar4->m_intensity)); pCVar3 = pCVar3 + 1) {
    pCVar4 = pCVar4 + 1;
  }
  return pCVar4 == pCVar1;
}

Assistant:

bool xmrig::CpuThreads::isEqual(const CpuThreads &other) const
{
    if (isEmpty() && other.isEmpty()) {
        return true;
    }

    return count() == other.count() && std::equal(m_data.begin(), m_data.end(), other.m_data.begin());
}